

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2_p.h
# Opt level: O3

void * __thiscall QGles2CommandBuffer::retainData(QGles2CommandBuffer *this,QByteArray *data)

{
  undefined8 *puVar1;
  long in_FS_OFFSET;
  QByteArray local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.s ==
      (this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.a) {
    local_30.d.d = (data->d).d;
    local_30.d.ptr = (data->d).ptr;
    local_30.d.size = (data->d).size;
    if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_30.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_30.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVLABase<QByteArray>::emplace_back_impl<QByteArray>
              (&(this->dataRetainPool).super_QVLABase<QByteArray>,4,
               &(this->dataRetainPool).super_QVLAStorage<24UL,_8UL,_4LL>,&local_30);
    if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    QVLABase<QByteArray>::emplace_back_impl<QByteArray_const&>
              (&(this->dataRetainPool).super_QVLABase<QByteArray>,4,
               &(this->dataRetainPool).super_QVLAStorage<24UL,_8UL,_4LL>,data);
  }
  puVar1 = *(undefined8 **)
            ((long)(this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.ptr +
            (this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.s * 0x18 + -0x10);
  if (puVar1 == (undefined8 *)0x0) {
    puVar1 = &QByteArray::_empty;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return puVar1;
  }
  __stack_chk_fail();
}

Assistant:

const void *retainData(const QByteArray &data) {
        dataRetainPool.append(data);
        return dataRetainPool.last().constData();
    }